

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O2

GArray * g_array_set_size(GArray *farray,guint length)

{
  uint uVar1;
  
  uVar1 = farray->len;
  if (length <= uVar1) {
    if (length <= uVar1 && uVar1 - length != 0) {
      g_array_remove_range(farray,length,uVar1 - length);
    }
  }
  else {
    g_array_maybe_expand((GRealArray *)farray,length - uVar1);
    if (((ulong)farray[1].data & 0x200000000) != 0) {
      memset(farray->data + farray->len * *(int *)&farray[1].data,0,
             (ulong)((length - farray->len) * *(int *)&farray[1].data));
    }
  }
  farray->len = length;
  if (((ulong)farray[1].data & 0x100000000) != 0) {
    memset(farray->data + length * *(uint *)&farray[1].data,0,(ulong)*(uint *)&farray[1].data);
  }
  return farray;
}

Assistant:

GArray* g_array_set_size (GArray *farray,
        guint   length)
{
    GRealArray *array = (GRealArray*) farray;

    g_return_val_if_fail (array, NULL);

    if (length > array->len)
    {
        g_array_maybe_expand (array, length - array->len);

        if (array->clear)
            g_array_elt_zero (array, array->len, length - array->len);
    }
    else if (length < array->len)
        g_array_remove_range (farray, length, array->len - length);

    array->len = length;

    g_array_zero_terminate (array);

    return farray;
}